

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O1

void __thiscall memory_io_buf::memory_io_buf(memory_io_buf *this)

{
  int local_1c;
  
  (this->super_io_buf)._vptr_io_buf = (_func_int **)&PTR_open_file_002e8c18;
  (this->super_io_buf).space._begin = (char *)0x0;
  (this->super_io_buf).space._end = (char *)0x0;
  (this->super_io_buf).space.end_array = (char *)0x0;
  (this->super_io_buf).space.erase_count = 0;
  (this->super_io_buf).files._begin = (int *)0x0;
  (this->super_io_buf).files._end = (int *)0x0;
  (this->super_io_buf).files.end_array = (int *)0x0;
  (this->super_io_buf).files.erase_count = 0;
  (this->super_io_buf).currentname._begin = (char *)0x0;
  (this->super_io_buf).currentname._end = (char *)0x0;
  (this->super_io_buf).currentname.end_array = (char *)0x0;
  (this->super_io_buf).currentname.erase_count = 0;
  (this->super_io_buf).finalname._begin = (char *)0x0;
  (this->super_io_buf).finalname._end = (char *)0x0;
  (this->super_io_buf).finalname.end_array = (char *)0x0;
  (this->super_io_buf).finalname.erase_count = 0;
  v_array<char>::resize(&(this->super_io_buf).space,0x10000);
  (this->super_io_buf).count = 0;
  (this->super_io_buf).current = 0;
  (this->super_io_buf).head = (this->super_io_buf).space._begin;
  (this->super_io_buf)._verify_hash = false;
  (this->super_io_buf)._hash = 0;
  (this->super_io_buf)._vptr_io_buf = (_func_int **)&PTR_open_file_002e8b90;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->readOffset = 0;
  local_1c = -1;
  v_array<int>::push_back(&(this->super_io_buf).files,&local_1c);
  return;
}

Assistant:

memory_io_buf() : readOffset(0) {
        files.push_back(-1); // this is a hack because buf will do nothing if files is empty
    }